

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void fmt::v11::detail::value<fmt::v11::context>::
     format_custom<Chunk,fmt::v11::formatter<Chunk,char,void>>
               (void *arg,parse_context<char> *parse_ctx,context *ctx)

{
  iterator iVar1;
  context *in_RDX;
  formatter<Chunk,_char,_void> *cf;
  formatter<Chunk,_char,_void> f;
  context *in_stack_00000398;
  Chunk *in_stack_000003a0;
  basic_ostream_formatter<char> *in_stack_000003a8;
  iterator in_stack_ffffffffffffffa8;
  parse_context<char> *in_stack_ffffffffffffffb0;
  native_formatter<fmt::v11::basic_string_view<char>,_char,_(fmt::v11::detail::type)13>
  *in_stack_ffffffffffffffb8;
  
  memset(&stack0xffffffffffffffb8,0,0x30);
  formatter<Chunk,_char,_void>::formatter((formatter<Chunk,_char,_void> *)0x27472e);
  native_formatter<fmt::v11::basic_string_view<char>,_char,_(fmt::v11::detail::type)13>::parse
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  parse_context<char>::advance_to(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  iVar1 = basic_ostream_formatter<char>::format<Chunk,fmt::v11::context>
                    (in_stack_000003a8,in_stack_000003a0,in_stack_00000398);
  context::advance_to(in_RDX,iVar1);
  return;
}

Assistant:

static void format_custom(void* arg, parse_context<char_type>& parse_ctx,
                            Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_formatter<const T, char_type>(), const T, T>;
    // format must be const for compatibility with std::format and compilation.
    const auto& cf = f;
    ctx.advance_to(cf.format(*static_cast<qualified_type*>(arg), ctx));
  }